

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVE.cpp
# Opt level: O1

void __thiscall OpenMD::NVE::moveB(NVE *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  Snapshot *pSVar5;
  uint i_1;
  Molecule *pMVar6;
  long lVar7;
  Vector3d *pVVar8;
  uint i_3;
  long lVar9;
  StuntDouble *this_00;
  pointer ppSVar10;
  Vector<double,_3U> result;
  Vector3d ji;
  Vector3d vel;
  MoleculeIterator i;
  Vector3d Tb;
  Vector3d frc;
  Vector3d local_e8;
  double local_c8 [4];
  double local_a8 [3];
  MoleculeIterator local_90;
  double local_88 [4];
  double local_68 [4];
  Vector3d local_48;
  
  local_90._M_node = (_Base_ptr)0x0;
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  pMVar6 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_90);
  if (pMVar6 != (Molecule *)0x0) {
    do {
      ppSVar10 = (pMVar6->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar10 ==
          (pMVar6->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (StuntDouble *)0x0;
      }
      else {
        this_00 = *ppSVar10;
      }
      while (this_00 != (StuntDouble *)0x0) {
        pSVar5 = this_00->snapshotMan_->currentSnapshot_;
        lVar7 = *(long *)((long)&(pSVar5->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
        lVar9 = (long)this_00->localIndex_ * 0x18;
        local_a8[2] = (double)*(undefined8 *)(lVar7 + 0x10 + lVar9);
        pdVar1 = (double *)(lVar7 + lVar9);
        local_a8[0] = *pdVar1;
        local_a8[1] = pdVar1[1];
        lVar7 = *(long *)((long)&(pSVar5->atomData).force.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
        local_68[2] = (double)*(undefined8 *)(lVar7 + 0x10 + lVar9);
        pdVar1 = (double *)(lVar7 + lVar9);
        local_68[0] = *pdVar1;
        local_68[1] = pdVar1[1];
        dVar2 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
        dVar3 = this_00->mass_;
        local_e8.super_Vector<double,_3U>.data_[0] = 0.0;
        local_e8.super_Vector<double,_3U>.data_[1] = 0.0;
        local_e8.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar7 = 0;
        do {
          local_e8.super_Vector<double,_3U>.data_[lVar7] =
               local_68[lVar7] * (dVar2 / dVar3) * 0.0004184;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar7 = 0;
        do {
          local_a8[lVar7] = local_e8.super_Vector<double,_3U>.data_[lVar7] + local_a8[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        pSVar5 = this_00->snapshotMan_->currentSnapshot_;
        lVar9 = (long)this_00->localIndex_;
        lVar7 = *(long *)((long)&(pSVar5->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
        *(double *)(lVar7 + 0x10 + lVar9 * 0x18) = local_a8[2];
        pdVar1 = (double *)(lVar7 + lVar9 * 0x18);
        *pdVar1 = local_a8[0];
        pdVar1[1] = local_a8[1];
        if (this_00->objType_ - otDAtom < 2) {
          pVVar8 = (Vector3d *)
                   (lVar9 * 0x18 +
                   *(long *)((long)&(pSVar5->atomData).torque.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + this_00->storage_));
          local_48.super_Vector<double,_3U>.data_[0] = 0.0;
          local_48.super_Vector<double,_3U>.data_[1] = 0.0;
          local_48.super_Vector<double,_3U>.data_[2] = 0.0;
          if (pVVar8 != &local_48) {
            lVar7 = 0;
            do {
              local_48.super_Vector<double,_3U>.data_[lVar7] =
                   (pVVar8->super_Vector<double,_3U>).data_[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
          }
          StuntDouble::lab2Body(&local_e8,this_00,&local_48);
          local_88[2] = local_e8.super_Vector<double,_3U>.data_[2];
          local_88[0] = local_e8.super_Vector<double,_3U>.data_[0];
          local_88[1] = local_e8.super_Vector<double,_3U>.data_[1];
          lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                   angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          local_c8[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)this_00->localIndex_ * 0x18);
          pdVar1 = (double *)(lVar7 + (long)this_00->localIndex_ * 0x18);
          local_c8[0] = *pdVar1;
          local_c8[1] = pdVar1[1];
          dVar2 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
          local_e8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_e8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_e8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar7 = 0;
          do {
            local_e8.super_Vector<double,_3U>.data_[lVar7] = local_88[lVar7] * dVar2 * 0.0004184;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar7 = 0;
          do {
            local_c8[lVar7] = local_e8.super_Vector<double,_3U>.data_[lVar7] + local_c8[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          iVar4 = this_00->localIndex_;
          lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                   angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          *(double *)(lVar7 + 0x10 + (long)iVar4 * 0x18) = local_c8[2];
          pdVar1 = (double *)(lVar7 + (long)iVar4 * 0x18);
          *pdVar1 = local_c8[0];
          pdVar1[1] = local_c8[1];
        }
        ppSVar10 = ppSVar10 + 1;
        if (ppSVar10 ==
            (pMVar6->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = (StuntDouble *)0x0;
        }
        else {
          this_00 = *ppSVar10;
        }
      }
      pMVar6 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_90);
    } while (pMVar6 != (Molecule *)0x0);
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
  return;
}

Assistant:

void NVE::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d vel;
    Vector3d frc;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel  = sd->getVel();
        frc  = sd->getFrc();
        mass = sd->getMass();

        // velocity half step
        vel += (dt2 / mass * Constants::energyConvert) * frc;

        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += (dt2 * Constants::energyConvert) * Tb;

          sd->setJ(ji);
        }
      }
    }

    flucQ_->moveB();
    rattle_->constraintB();
  }